

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

int complt(int flags,int c,char *buf,size_t nbuf,int cpos,int *nx)

{
  int iVar1;
  size_t sVar2;
  int local_80;
  char *local_78;
  char *msg;
  int wflag;
  int nshown;
  int msglen;
  int bxtra;
  int nhits;
  int nxtra;
  int i;
  list *wholelist;
  list *lh2;
  list *lh;
  int *nx_local;
  int cpos_local;
  size_t nbuf_local;
  char *buf_local;
  int c_local;
  int flags_local;
  
  _nxtra = (list *)0x0;
  msg._4_4_ = 0;
  wholelist = (list *)0x0;
  if ((flags & 1U) == 0) {
    if ((flags & 2U) == 0) {
      if ((flags & 4U) == 0) {
        panic("broken complt call: flags");
      }
      buf[cpos] = '\0';
      _nxtra = make_file_list(buf);
      lh2 = _nxtra;
    }
    else {
      lh2 = &bheadp->b_list;
    }
  }
  else {
    buf[cpos] = '\0';
    _nxtra = complete_function_list(buf);
    lh2 = _nxtra;
  }
  if (c == 0x20) {
    msg._4_4_ = 1;
  }
  else if ((c != 9) && (c != 0xd)) {
    panic("broken complt call: c");
  }
  msglen = 0;
  bxtra = 1000;
  for (; lh2 != (list *)0x0; lh2 = (lh2->l_p).l_nxt) {
    iVar1 = memcmp(buf,lh2->l_name,(long)cpos);
    if (iVar1 == 0) {
      if (msglen == 0) {
        wholelist = lh2;
      }
      msglen = msglen + 1;
      if (lh2->l_name[cpos] == '\0') {
        bxtra = -1;
      }
      else {
        iVar1 = getxtra(lh2,wholelist,cpos,msg._4_4_);
        if (iVar1 < bxtra) {
          bxtra = iVar1;
        }
        wholelist = lh2;
      }
    }
  }
  if (msglen == 0) {
    local_78 = " [No match]";
  }
  else {
    if ((msglen < 2) || (bxtra != 0)) {
      if ((bxtra < 0) && ((1 < msglen && (c == 0x20)))) {
        bxtra = 1;
      }
      nx_local._4_4_ = cpos;
      for (nhits = 0; nhits < bxtra && (ulong)(long)nx_local._4_4_ < nbuf; nhits = nhits + 1) {
        buf[nx_local._4_4_] = wholelist->l_name[nx_local._4_4_];
        eputc(buf[nx_local._4_4_]);
        nx_local._4_4_ = nx_local._4_4_ + 1;
      }
      ttflush();
      free_file_list(_nxtra);
      *nx = bxtra;
      if ((bxtra < 0) && (c != 0xd)) {
        *nx = 0;
      }
      return 1;
    }
    local_78 = " [Ambiguous. Ctrl-G to cancel]";
  }
  free_file_list(_nxtra);
  sVar2 = strlen(local_78);
  local_80 = (int)sVar2;
  if (ncol < ttcol + local_80 + 2) {
    local_80 = (ncol - ttcol) + -2;
  }
  eputs(local_78);
  nhits = local_80;
  ttcol = ttcol - local_80;
  while (nhits != 0) {
    ttputc(8);
    nhits = nhits + -1;
  }
  ttflush();
  nhits = local_80;
  while (nhits != 0) {
    eputc(' ');
    nhits = nhits + -1;
  }
  nhits = local_80;
  ttcol = ttcol - local_80;
  while (nhits != 0) {
    ttputc(8);
    nhits = nhits + -1;
  }
  *nx = bxtra;
  return (uint)(0 < msglen);
}

Assistant:

static int
complt(int flags, int c, char *buf, size_t nbuf, int cpos, int *nx)
{
	struct list	*lh, *lh2;
	struct list	*wholelist = NULL;
	int	 i, nxtra, nhits, bxtra, msglen, nshown;
	int	 wflag = FALSE;
	char	*msg;

	lh = lh2 = NULL;

	if ((flags & EFFUNC) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = complete_function_list(buf);
	} else if ((flags & EFBUF) != 0) {
		lh = &(bheadp->b_list);
	} else if ((flags & EFFILE) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = make_file_list(buf);
	} else
		panic("broken complt call: flags");

	if (c == ' ')
		wflag = TRUE;
	else if (c != '\t' && c != CCHR('M'))
		panic("broken complt call: c");

	nhits = 0;
	nxtra = HUGE;

	for (; lh != NULL; lh = lh->l_next) {
		if (memcmp(buf, lh->l_name, cpos) != 0)
			continue;
		if (nhits == 0)
			lh2 = lh;
		++nhits;
		if (lh->l_name[cpos] == '\0')
			nxtra = -1; /* exact match */
		else {
			bxtra = getxtra(lh, lh2, cpos, wflag);
			if (bxtra < nxtra)
				nxtra = bxtra;
			lh2 = lh;
		}
	}
	if (nhits == 0)
		msg = " [No match]";
	else if (nhits > 1 && nxtra == 0)
		msg = " [Ambiguous. Ctrl-G to cancel]";
	else {
		/*
		 * Being lazy - ought to check length, but all things
		 * autocompleted have known types/lengths.
		 */
		if (nxtra < 0 && nhits > 1 && c == ' ')
			nxtra = 1; /* ??? */
		for (i = 0; i < nxtra && cpos < nbuf; ++i) {
			buf[cpos] = lh2->l_name[cpos];
			eputc(buf[cpos++]);
		}
		/* XXX should grow nbuf */
		ttflush();
		free_file_list(wholelist);
		*nx = nxtra;
		if (nxtra < 0 && c != CCHR('M')) /* exact */
			*nx = 0;
		return (TRUE);
	}

	/*
	 * wholelist is NULL if we are doing buffers.  Want to free lists
	 * that were created for us, but not the buffer list!
	 */
	free_file_list(wholelist);

	/* Set up backspaces, etc., being mindful of echo line limit. */
	msglen = strlen(msg);
	nshown = (ttcol + msglen + 2 > ncol) ?
		ncol - ttcol - 2 : msglen;
	eputs(msg);
	ttcol -= (i = nshown);	/* update ttcol!		 */
	while (i--)		/* move back before msg		 */
		ttputc('\b');
	ttflush();		/* display to user		 */
	i = nshown;
	while (i--)		/* blank out on next flush	 */
		eputc(' ');
	ttcol -= (i = nshown);	/* update ttcol on BS's		 */
	while (i--)
		ttputc('\b');	/* update ttcol again!		 */
	*nx = nxtra;
	return ((nhits > 0) ? TRUE : FALSE);
}